

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

void VW::copy_example_data(bool audit,example *dst,example *src)

{
  uchar *_begin;
  byte *pbVar1;
  v_array<unsigned_char> *__range1;
  byte *pbVar2;
  
  copy_example_metadata(false,dst,src);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)dst);
  _begin = (src->super_example_predict).indices._begin;
  push_many<unsigned_char>
            ((v_array<unsigned_char> *)dst,_begin,
             (long)(src->super_example_predict).indices._end - (long)_begin);
  pbVar1 = (src->super_example_predict).indices._end;
  for (pbVar2 = (src->super_example_predict).indices._begin; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
  {
    features::deep_copy_from
              ((dst->super_example_predict).feature_space + *pbVar2,
               (src->super_example_predict).feature_space + *pbVar2);
  }
  dst->num_features = src->num_features;
  dst->total_sum_feat_sq = src->total_sum_feat_sq;
  return;
}

Assistant:

void copy_example_data(bool audit, example* dst, example* src)
{
  // std::cerr << "copy_example_data dst = " << dst << std::endl;
  copy_example_metadata(audit, dst, src);

  // copy feature data
  copy_array(dst->indices, src->indices);
  for (namespace_index c : src->indices) dst->feature_space[c].deep_copy_from(src->feature_space[c]);
  // copy_array(dst->atomics[i], src->atomics[i]);
  dst->num_features = src->num_features;
  dst->total_sum_feat_sq = src->total_sum_feat_sq;
}